

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

int32_t __thiscall icu_63::SkippedState::backwardNumCodePoints(SkippedState *this,int32_t n)

{
  short sVar1;
  int index;
  int32_t iVar2;
  int iVar3;
  int index_00;
  
  sVar1 = (this->oldBuffer).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    index_00 = (this->oldBuffer).fUnion.fFields.fLength;
  }
  else {
    index_00 = (int)sVar1 >> 5;
  }
  index = this->pos;
  iVar3 = index - index_00;
  if (iVar3 == 0 || index < index_00) {
    iVar2 = UnicodeString::moveIndex32(&this->oldBuffer,index,-n);
    n = 0;
  }
  else if (iVar3 < n) {
    iVar2 = UnicodeString::moveIndex32(&this->oldBuffer,index_00,iVar3 - n);
    n = iVar3;
  }
  else {
    iVar2 = index - n;
  }
  this->pos = iVar2;
  return n;
}

Assistant:

int32_t backwardNumCodePoints(int32_t n) {
        int32_t length = oldBuffer.length();
        int32_t beyond = pos - length;
        if(beyond > 0) {
            if(beyond >= n) {
                // Not back far enough to re-enter the oldBuffer.
                pos -= n;
                return n;
            } else {
                // Back out all beyond-oldBuffer code points and re-enter the buffer.
                pos = oldBuffer.moveIndex32(length, beyond - n);
                return beyond;
            }
        } else {
            // Go backwards from inside the oldBuffer.
            pos = oldBuffer.moveIndex32(pos, -n);
            return 0;
        }
    }